

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_FlagSaverTest_CanSaveStringFlagStates::Run(void)

{
  int iVar1;
  undefined8 extraout_RAX;
  FlagSettingMode in_R8D;
  FlagSaver fs;
  FlagSaver fs_1;
  FlagSaver local_110;
  undefined1 local_108 [32];
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  FlagSaver::FlagSaver(&local_110);
  fprintf(_stderr,"Running test %s/%s\n","FlagSaverTest");
  SetCommandLineOptionWithMode_abi_cxx11_(&local_28,(gflags *)0x14f4a4,"second",(char *)0x0,in_R8D);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  SetCommandLineOptionWithMode_abi_cxx11_(&local_48,(gflags *)0x14f4cb,"second",(char *)0x2,in_R8D);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  FlagSaver::FlagSaver((FlagSaver *)local_108);
  SetCommandLineOptionWithMode_abi_cxx11_(&local_68,(gflags *)0x14f46f,"second",(char *)0x0,in_R8D);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str1_abi_cxx11_);
  if (iVar1 == 0) {
    SetCommandLineOptionWithMode_abi_cxx11_(&local_88,(gflags *)0x14f4a4,"third",(char *)0x2,in_R8D)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str2_abi_cxx11_);
    if (iVar1 != 0) goto LAB_0013778f;
    SetCommandLineOptionWithMode_abi_cxx11_(&local_a8,(gflags *)0x14f4cb,"third",(char *)0x0,in_R8D)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str3_abi_cxx11_);
    if (iVar1 != 0) goto LAB_00137794;
    FlagSaver::~FlagSaver((FlagSaver *)local_108);
    iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str1_abi_cxx11_);
    if (iVar1 != 0) goto LAB_00137799;
    SetCommandLineOptionWithMode_abi_cxx11_
              ((string *)local_108,(gflags *)0x14f46f,"second",(char *)0x1,in_R8D);
    if ((FlagSaverImpl *)local_108._0_8_ != (FlagSaverImpl *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_);
    }
    iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str1_abi_cxx11_);
    if (iVar1 != 0) goto LAB_0013779e;
    iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str2_abi_cxx11_);
    if (iVar1 != 0) goto LAB_001377a3;
    SetCommandLineOptionWithMode_abi_cxx11_
              (&local_c8,(gflags *)0x14f4a4,"fourth",(char *)0x1,in_R8D);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str2_abi_cxx11_);
    if (iVar1 != 0) goto LAB_001377a8;
    iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str3_abi_cxx11_);
    if (iVar1 == 0) {
      SetCommandLineOptionWithMode_abi_cxx11_
                (&local_e8,(gflags *)0x14f4cb,"fourth",(char *)0x1,in_R8D);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_str3_abi_cxx11_);
      if (iVar1 == 0) {
        FlagSaver::~FlagSaver(&local_110);
        return;
      }
      goto LAB_001377b2;
    }
  }
  else {
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveStringFlagStates::Run();
LAB_0013778f:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveStringFlagStates::Run();
LAB_00137794:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveStringFlagStates::Run();
LAB_00137799:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveStringFlagStates::Run();
LAB_0013779e:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveStringFlagStates::Run();
LAB_001377a3:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveStringFlagStates::Run();
LAB_001377a8:
    _GLOBAL__N_1::Test_FlagSaverTest_CanSaveStringFlagStates::Run();
  }
  _GLOBAL__N_1::Test_FlagSaverTest_CanSaveStringFlagStates::Run();
LAB_001377b2:
  _GLOBAL__N_1::Test_FlagSaverTest_CanSaveStringFlagStates::Run();
  FlagSaver::~FlagSaver((FlagSaver *)local_108);
  FlagSaver::~FlagSaver(&local_110);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(FlagSaverTest, CanSaveStringFlagStates) {
  // 1. Initializes the flags.

  // State of flag test_str1:
  //   default value - "initial"
  //   current value - "initial"
  //   not set       - true

  SetCommandLineOptionWithMode("test_str2", "second", SET_FLAGS_VALUE);
  // State of flag test_str2:
  //   default value - "initial"
  //   current value - "second"
  //   not set       - false

  SetCommandLineOptionWithMode("test_str3", "second", SET_FLAGS_DEFAULT);
  // State of flag test_str3:
  //   default value - "second"
  //   current value - "second"
  //   not set       - true

  // 2. Saves the flag states.

  {
    FlagSaver fs;

    // 3. Modifies the flag states.

    SetCommandLineOptionWithMode("test_str1", "second", SET_FLAGS_VALUE);
    EXPECT_EQ("second", FLAGS_test_str1);
    // State of flag test_str1:
    //   default value - "second"
    //   current value - "second"
    //   not set       - true

    SetCommandLineOptionWithMode("test_str2", "third", SET_FLAGS_DEFAULT);
    EXPECT_EQ("second", FLAGS_test_str2);
    // State of flag test_str2:
    //   default value - "third"
    //   current value - "second"
    //   not set       - false

    SetCommandLineOptionWithMode("test_str3", "third", SET_FLAGS_VALUE);
    EXPECT_EQ("third", FLAGS_test_str3);
    // State of flag test_str1:
    //   default value - "second"
    //   current value - "third"
    //   not set       - false

    // 4. Restores the flag states.
  }

  // 5. Verifies that the states were restored.

  // Verifies that the value of test_str1 was restored.
  EXPECT_EQ("initial", FLAGS_test_str1);
  // Verifies that the "not set" attribute of test_str1 was restored to true.
  SetCommandLineOptionWithMode("test_str1", "second", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str1);

  // Verifies that the value of test_str2 was restored.
  EXPECT_EQ("second", FLAGS_test_str2);
  // Verifies that the "not set" attribute of test_str2 was restored to false.
  SetCommandLineOptionWithMode("test_str2", "fourth", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("second", FLAGS_test_str2);

  // Verifies that the value of test_str3 was restored.
  EXPECT_EQ("second", FLAGS_test_str3);
  // Verifies that the "not set" attribute of test_str3 was restored to true.
  SetCommandLineOptionWithMode("test_str3", "fourth", SET_FLAG_IF_DEFAULT);
  EXPECT_EQ("fourth", FLAGS_test_str3);
}